

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O1

ssize_t __thiscall pstore::broker::player::read(player *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  void *__s;
  pointer *__ptr;
  undefined4 in_register_00000034;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = (mutex_type *)pool;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  uVar1 = pool._56_8_;
  local_30._M_owns = true;
  if (pool._88_8_ == pool._56_8_) {
    std::unique_lock<std::mutex>::unlock(&local_30);
    __s = operator_new(0x100);
    memset(__s,0,0x100);
    *(undefined2 *)((long)__s + 10) = 1;
    memset((void *)((long)__s + 0xc),0,0xf4);
    (this->mut_).super___mutex_base._M_mutex.__align = (long)__s;
  }
  else {
    (this->mut_).super___mutex_base._M_mutex.__align = *(long *)pool._56_8_;
    *(undefined8 *)uVar1 = 0;
    std::
    deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
    ::pop_front((deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
                 *)(pool + 0x28));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)CONCAT44(in_register_00000034,__fd);
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  pstore::file::file_base::read<pstore::brokerface::message_type,void>
            ((file_base *)((mutex_type *)CONCAT44(in_register_00000034,__fd) + 1),
             (message_type *)(this->mut_).super___mutex_base._M_mutex.__align);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return (ssize_t)this;
}

Assistant:

brokerface::message_ptr player::read () {
            brokerface::message_ptr msg = pool.get_from_pool ();
            std::unique_lock<decltype (mut_)> const lock (mut_);
            file_.read (msg.get ());
            return msg;
        }